

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Print(Mat *this,char *title)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  char *title_local;
  Mat *this_local;
  
  printf("%s\n",title);
  for (local_1c = 0; local_1c < this->n_rows_; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->n_cols_ + -1; local_20 = local_20 + 1) {
      printf("%+5.2f ",this->v_[(long)(local_1c * this->n_cols_) + (long)local_20]);
    }
    printf("%+5.2f\n",this->v_[(long)(local_1c * this->n_cols_) + (long)this->n_cols_ + -1]);
  }
  return;
}

Assistant:

void Mat::Print(const char *title){
  printf("%s\n", title);
  for (int i=0; i<n_rows_; i++){
    for (int j=0; j<n_cols_-1; j++){
      printf("%+5.2f ", *(v_+i*n_cols_ + j));
    }
    printf("%+5.2f\n", *(v_+i*n_cols_ + n_cols_-1));
  }
}